

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void container_printf_as_uint32_array(container_t *c,uint8_t typecode,uint32_t base)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  undefined7 in_register_00000031;
  char *__format;
  ulong uVar4;
  long lVar5;
  
  uVar3 = (uint)CONCAT71(in_register_00000031,typecode);
  if (uVar3 == 4) {
    uVar3 = (uint)*(byte *)((long)c + 8);
    c = *c;
  }
  if ((char)uVar3 != '\x03') {
    if ((uVar3 & 0xff) == 2) {
      array_container_printf_as_uint32_array((array_container_t *)c,base);
      return;
    }
    bVar2 = true;
    lVar5 = 0;
    do {
      uVar4 = *(ulong *)(((array_container_t *)c)->array + lVar5 * 4);
      if (uVar4 != 0) {
        __format = ",%u";
        if (bVar2) {
          __format = "%u";
        }
        do {
          lVar1 = 0;
          if (uVar4 != 0) {
            for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
            }
          }
          bVar2 = false;
          printf(__format,(ulong)((int)lVar1 + base));
          uVar4 = uVar4 & uVar4 - 1;
          __format = ",%u";
        } while (uVar4 != 0);
      }
      base = base + 0x40;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x400);
    return;
  }
  run_container_printf_as_uint32_array((run_container_t *)c,base);
  return;
}

Assistant:

void container_printf_as_uint32_array(const container_t *c, uint8_t typecode,
                                      uint32_t base) {
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            bitset_container_printf_as_uint32_array(const_CAST_bitset(c), base);
            return;
        case ARRAY_CONTAINER_TYPE:
            array_container_printf_as_uint32_array(const_CAST_array(c), base);
            return;
        case RUN_CONTAINER_TYPE:
            run_container_printf_as_uint32_array(const_CAST_run(c), base);
            return;
        default:
            roaring_unreachable;
    }
}